

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::NonarrayType> __thiscall
mocker::Parser::nonarrayType(Parser *this,TokIter *iter,TokIter end)

{
  undefined8 uVar1;
  TokIter TVar2;
  mapped_type *pmVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<mocker::ast::NonarrayType> sVar5;
  Position beg;
  shared_ptr<mocker::ast::BuiltinType> res;
  undefined1 local_58 [24];
  TokIter aTStack_40 [2];
  Token *local_30;
  
  builtinType((Parser *)local_58,iter,end);
  uVar1 = local_58._8_8_;
  if ((Token *)local_58._0_8_ == (Token *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    identifier((Parser *)local_58,iter,end);
    if ((Token *)local_58._0_8_ == (Token *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      (this->tokBeg)._M_current = (Token *)0x0;
      (this->tokEnd)._M_current = (Token *)0x0;
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_0017011d;
    }
    local_30 = (Token *)local_58._0_8_;
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)iter[2]._M_current,(key_type *)&local_30);
    beg.col = (pmVar3->first).line;
    beg.line = (size_t)iter;
    makeNode<mocker::ast::UserDefinedType,std::shared_ptr<mocker::ast::Identifier>&>
              ((Parser *)(local_58 + 0x10),beg,*(Position *)&(pmVar3->first).col,
               (shared_ptr<mocker::ast::Identifier> *)(pmVar3->second).col);
    TVar2._M_current = aTStack_40[0]._M_current;
    aTStack_40[0]._M_current = (Token *)0x0;
    (this->tokBeg)._M_current = (Token *)local_58._16_8_;
    (this->tokEnd)._M_current = TVar2._M_current;
    local_58._16_8_ = (Token *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)aTStack_40);
  }
  else {
    (this->tokBeg)._M_current = (Token *)local_58._0_8_;
    local_58._8_8_ = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)uVar1;
    local_58._0_8_ = (Token *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  _Var4._M_pi = extraout_RDX;
LAB_0017011d:
  sVar5.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::NonarrayType>)
         sVar5.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::NonarrayType> Parser::nonarrayType(TokIter &iter,
                                                        TokIter end) {
  if (auto res = builtinType(iter, end))
    return res;
  if (auto id = identifier(iter, end))
    return makeNode<ast::UserDefinedType>(pos[id->getID()], id);
  return nullptr;
}